

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_squares_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_26bbc3a::SSETest::RunTest
          (SSETest *this,bool is_random,int width,int height,int run_times)

{
  int iVar1;
  undefined8 *puVar2;
  undefined2 uVar3;
  uint32_t uVar4;
  ulong uVar5;
  uint uVar6;
  uint8_t *puVar7;
  long lVar8;
  int iVar9;
  ACMRandom *pAVar10;
  uchar *puVar11;
  uint uVar12;
  uchar *puVar13;
  undefined7 in_register_00000031;
  char *pcVar14;
  uint8_t *puVar15;
  SEARCH_METHODS *message;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  int64_t res_ref;
  AssertionResult gtest_ar;
  int64_t res_tst;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_f0;
  int local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  int local_d4;
  uchar *local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b8;
  ACMRandom *local_b0;
  int local_a8;
  undefined4 local_a4;
  ulong local_a0;
  long local_98;
  internal local_90 [8];
  undefined8 *local_88;
  AssertHelper local_80;
  long local_78;
  timeval local_70;
  timeval local_60;
  timeval local_50;
  timeval local_40;
  
  local_a4 = (undefined4)CONCAT71(in_register_00000031,is_random);
  local_b0 = &this->rnd_;
  local_a0 = (ulong)(uint)height;
  local_c0 = (ulong)(uint)width;
  local_e8 = 0;
  iVar9 = 0;
  pAVar10 = local_b0;
  local_e4 = height;
  local_dc = width;
  local_d8 = run_times;
  do {
    do {
      uVar4 = testing::internal::Random::Generate(&pAVar10->random_,7);
      iVar17 = 4 << ((byte)uVar4 & 0x1f);
    } while (iVar17 < width);
    local_e0 = iVar17;
    local_d4 = iVar9;
    if ((char)local_a4 == '\0') {
      uVar3 = 0xff;
      if (this->is_hbd_ != false) {
        uVar3 = 0xfff;
      }
      if (iVar9 == 0) {
        if (0 < height) {
          puVar7 = this->src_;
          uVar5 = 0;
          puVar15 = puVar7;
          do {
            if (0 < width) {
              uVar16 = 0;
              do {
                if (this->is_hbd_ == false) {
                  puVar7[uVar16] = '\0';
                }
                else {
                  (puVar15 + uVar16 * 2)[0] = '\0';
                  (puVar15 + uVar16 * 2)[1] = '\0';
                }
                uVar16 = uVar16 + 1;
              } while (local_c0 != uVar16);
            }
            uVar5 = uVar5 + 1;
            puVar15 = puVar15 + (long)iVar17 * 2;
            puVar7 = puVar7 + iVar17;
          } while (uVar5 != local_a0);
        }
        if (0 < height) {
          puVar7 = this->ref_;
          uVar5 = 0;
          puVar15 = puVar7;
          do {
            if (0 < width) {
              uVar16 = 0;
              do {
                if (this->is_hbd_ == false) {
                  puVar7[uVar16] = 0xff;
                }
                else {
                  *(undefined2 *)(puVar15 + uVar16 * 2) = uVar3;
                }
                uVar16 = uVar16 + 1;
              } while (local_c0 != uVar16);
            }
            uVar5 = uVar5 + 1;
            puVar15 = puVar15 + (long)iVar17 * 2;
            puVar7 = puVar7 + iVar17;
          } while (uVar5 != local_a0);
        }
      }
      else {
        lVar8 = (long)iVar17;
        if (0 < height) {
          puVar7 = this->src_;
          uVar5 = 0;
          puVar15 = puVar7;
          do {
            if (0 < width) {
              uVar16 = 0;
              do {
                if (this->is_hbd_ == false) {
                  puVar7[uVar16] = 0xff;
                }
                else {
                  *(undefined2 *)(puVar15 + uVar16 * 2) = uVar3;
                }
                uVar16 = uVar16 + 1;
              } while (local_c0 != uVar16);
            }
            uVar5 = uVar5 + 1;
            puVar15 = puVar15 + lVar8 * 2;
            puVar7 = puVar7 + lVar8;
          } while (uVar5 != local_a0);
        }
        if (0 < height) {
          puVar7 = this->ref_;
          uVar5 = 0;
          puVar15 = puVar7;
          do {
            if (0 < width) {
              uVar16 = 0;
              do {
                if (this->is_hbd_ == false) {
                  puVar7[uVar16] = '\0';
                }
                else {
                  (puVar15 + uVar16 * 2)[0] = '\0';
                  (puVar15 + uVar16 * 2)[1] = '\0';
                }
                uVar16 = uVar16 + 1;
              } while (local_c0 != uVar16);
            }
            uVar5 = uVar5 + 1;
            puVar15 = puVar15 + lVar8 * 2;
            puVar7 = puVar7 + lVar8;
          } while (uVar5 != local_a0);
        }
      }
    }
    else if (0 < height) {
      puVar7 = this->src_;
      puVar15 = this->ref_;
      local_c8 = (long)iVar17;
      puVar11 = (uchar *)0x0;
      uVar5 = 0;
      do {
        uVar16 = local_c0;
        local_d0 = puVar11;
        local_b8 = uVar5;
        if (0 < width) {
          do {
            pAVar10 = local_b0;
            if (this->is_hbd_ == false) {
              uVar4 = testing::internal::Random::Generate(&local_b0->random_,0x80000000);
              this->src_[(long)puVar11] = (uint8_t)(uVar4 >> 0x17);
              uVar4 = testing::internal::Random::Generate(&pAVar10->random_,0x80000000);
              this->ref_[(long)puVar11] = (uint8_t)(uVar4 >> 0x17);
            }
            else {
              uVar4 = testing::internal::Random::Generate(&local_b0->random_,0x1000);
              *(short *)(puVar7 + (long)puVar11 * 2) = (short)uVar4;
              uVar4 = testing::internal::Random::Generate(&pAVar10->random_,0x1000);
              *(short *)(puVar15 + (long)puVar11 * 2) = (short)uVar4;
            }
            puVar11 = puVar11 + 1;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
        uVar5 = local_b8 + 1;
        puVar11 = local_d0 + local_c8;
        width = local_dc;
      } while (uVar5 != local_a0);
    }
    iVar17 = local_e0;
    iVar9 = local_e4;
    puVar13 = (uchar *)((ulong)this->ref_ >> 1);
    puVar11 = (uchar *)((ulong)this->src_ >> 1);
    if (this->is_hbd_ == false) {
      puVar13 = this->ref_;
      puVar11 = this->src_;
    }
    local_98 = (*(this->params_).ref_func)(puVar11,local_e0,puVar13,local_e0,width,local_e4);
    local_d0 = puVar11;
    local_78 = (*(this->params_).tst_func)(puVar11,iVar17,puVar13,iVar17,width,iVar9);
    iVar9 = local_d8;
    width = local_dc;
    if (local_d8 < 2) {
      bVar18 = local_e8 == 0;
      local_e8 = 1;
      if (bVar18) {
        local_e8 = 0;
        bVar18 = local_98 != local_78;
        testing::internal::CmpHelperEQ<long,long>(local_90,"res_ref","res_tst",&local_98,&local_78);
        if (local_90[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_f0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10),"Error:",6);
          pcVar14 = " ";
          if ((ulong)this->is_hbd_ != 0) {
            pcVar14 = "hbd ";
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10),pcVar14,(ulong)this->is_hbd_ * 3 + 1)
          ;
          std::ostream::operator<<(local_f0._M_head_impl + 0x10,local_d4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10)," SSE Test [",0xb);
          std::ostream::operator<<(local_f0._M_head_impl + 0x10,width);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10),"x",1);
          std::ostream::operator<<(local_f0._M_head_impl + 0x10,local_e4);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_f0._M_head_impl + 0x10),
                     "] C output does not match optimized output.",0x2b);
          message = "";
          if (local_88 != (undefined8 *)0x0) {
            message = (SEARCH_METHODS *)*local_88;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_80,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/sum_squares_test.cc"
                     ,0x188,(char *)message);
          testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_f0);
          testing::internal::AssertHelper::~AssertHelper(&local_80);
          if (local_f0._M_head_impl !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            (**(code **)(*(long *)local_f0._M_head_impl + 8))();
          }
        }
        puVar2 = local_88;
        if (local_88 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_88 != local_88 + 2) {
            operator_delete((undefined8 *)*local_88);
          }
          operator_delete(puVar2);
        }
        local_e8 = CONCAT31((int3)((uint)local_e8 >> 8),bVar18);
      }
    }
    else {
      gettimeofday(&local_50,(__timezone_ptr_t)0x0);
      width = local_dc;
      iVar1 = local_e4;
      do {
        (*(this->params_).ref_func)(local_d0,iVar17,puVar13,iVar17,width,iVar1);
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      gettimeofday(&local_40,(__timezone_ptr_t)0x0);
      local_b8 = CONCAT44(local_b8._4_4_,(int)local_40.tv_sec - (int)local_50.tv_sec);
      local_c8 = local_40.tv_usec - local_50.tv_usec;
      local_a8 = (int)local_c8 + 1000000;
      if (-1 < local_c8) {
        local_a8 = (int)local_c8;
      }
      gettimeofday(&local_70,(__timezone_ptr_t)0x0);
      puVar11 = local_d0;
      iVar9 = local_d8;
      if (0 < local_d8) {
        do {
          (*(this->params_).tst_func)(puVar11,iVar17,puVar13,iVar17,width,local_e4);
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      uVar12 = ((int)local_b8 + (int)(local_c8 >> 0x3f)) * 1000000 + local_a8;
      gettimeofday(&local_60,(__timezone_ptr_t)0x0);
      lVar8 = local_60.tv_usec - local_70.tv_usec;
      iVar9 = (int)lVar8 + 1000000;
      if (-1 < lVar8) {
        iVar9 = (int)lVar8;
      }
      uVar6 = iVar9 + ((int)(lVar8 >> 0x3f) + ((int)local_60.tv_sec - (int)local_70.tv_sec)) *
                      1000000;
      printf("c_time=%d \t simd_time=%d \t gain=%d\n",(ulong)uVar12,(ulong)uVar6,
             (long)(int)uVar12 / (long)(int)uVar6 & 0xffffffff);
    }
    iVar9 = local_d4 + 1;
    pAVar10 = local_b0;
    height = local_e4;
  } while (iVar9 != 3);
  return;
}

Assistant:

void SSETest::RunTest(bool is_random, int width, int height, int run_times) {
  int failed = 0;
  aom_usec_timer ref_timer, test_timer;
  for (int k = 0; k < 3; k++) {
    int stride = 4 << rnd_(7);  // Up to 256 stride
    while (stride < width) {    // Make sure it's valid
      stride = 4 << rnd_(7);
    }
    if (is_random) {
      GenRandomData(width, height, stride);
    } else {
      const int msb = is_hbd_ ? 12 : 8;  // Up to 12 bit input
      const int limit = (1 << msb) - 1;
      if (k == 0) {
        GenExtremeData(width, height, stride, src_, 0);
        GenExtremeData(width, height, stride, ref_, limit);
      } else {
        GenExtremeData(width, height, stride, src_, limit);
        GenExtremeData(width, height, stride, ref_, 0);
      }
    }
    int64_t res_ref, res_tst;
    uint8_t *src = src_;
    uint8_t *ref = ref_;
    if (is_hbd_) {
      src = CONVERT_TO_BYTEPTR(src_);
      ref = CONVERT_TO_BYTEPTR(ref_);
    }
    res_ref = params_.ref_func(src, stride, ref, stride, width, height);
    res_tst = params_.tst_func(src, stride, ref, stride, width, height);
    if (run_times > 1) {
      aom_usec_timer_start(&ref_timer);
      for (int j = 0; j < run_times; j++) {
        params_.ref_func(src, stride, ref, stride, width, height);
      }
      aom_usec_timer_mark(&ref_timer);
      const int elapsed_time_c =
          static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

      aom_usec_timer_start(&test_timer);
      for (int j = 0; j < run_times; j++) {
        params_.tst_func(src, stride, ref, stride, width, height);
      }
      aom_usec_timer_mark(&test_timer);
      const int elapsed_time_simd =
          static_cast<int>(aom_usec_timer_elapsed(&test_timer));

      printf(
          "c_time=%d \t simd_time=%d \t "
          "gain=%d\n",
          elapsed_time_c, elapsed_time_simd,
          (elapsed_time_c / elapsed_time_simd));
    } else {
      if (!failed) {
        failed = res_ref != res_tst;
        EXPECT_EQ(res_ref, res_tst)
            << "Error:" << (is_hbd_ ? "hbd " : " ") << k << " SSE Test ["
            << width << "x" << height
            << "] C output does not match optimized output.";
      }
    }
  }
}